

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O1

void remove_dev(lys_deviation *dev,lys_module *module,unres_schema *unres)

{
  undefined1 *puVar1;
  lys_node *plVar2;
  lys_module *plVar3;
  char *__needle;
  lys_module *plVar4;
  char *pcVar5;
  size_t sVar6;
  lys_module *plVar7;
  ulong uVar8;
  lys_deviation *plVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  uint32_t local_34 [2];
  uint32_t idx;
  
  local_34[0] = 0;
  plVar2 = dev->orig_node;
  if (plVar2 == (lys_node *)0x0) {
    ly_log(module->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_schema.c"
           ,0x1258);
    return;
  }
  plVar7 = plVar2->module;
  if ((plVar7->field_0x40 & 1) != 0) {
    plVar7 = (lys_module *)plVar7->data;
  }
  plVar3 = plVar2->module;
  lys_switch_deviation(dev,module,unres);
  plVar4 = ly_ctx_get_module_iter(module->ctx,local_34);
  do {
    if (plVar4 == (lys_module *)0x0) {
      plVar7->field_0x40 = plVar7->field_0x40 & 0xcf;
      puVar1 = &plVar3->field_0x40;
      *puVar1 = *puVar1 & 0xcf;
      return;
    }
    if ((plVar4 != module) && (plVar4 != plVar7)) {
      uVar8 = (ulong)plVar4->deviation_size;
      bVar11 = uVar8 != 0;
      if (bVar11) {
        plVar9 = plVar4->deviation;
        __needle = plVar7->name;
        uVar10 = 1;
        do {
          pcVar5 = strstr(plVar9->target_name,__needle);
          if ((pcVar5 != (char *)0x0) && (sVar6 = strlen(__needle), pcVar5[sVar6] == ':')) {
            if (bVar11) {
              return;
            }
            break;
          }
          bVar11 = uVar10 < uVar8;
          plVar9 = plVar9 + 1;
          bVar12 = uVar10 != uVar8;
          uVar10 = uVar10 + 1;
        } while (bVar12);
      }
    }
    plVar4 = ly_ctx_get_module_iter(module->ctx,local_34);
  } while( true );
}

Assistant:

static void
remove_dev(struct lys_deviation *dev, const struct lys_module *module, struct unres_schema *unres)
{
    uint32_t idx = 0, j;
    const struct lys_module *mod;
    struct lys_module *target_mod, *target_submod;
    const char *ptr;

    if (dev->orig_node) {
        target_mod = lys_node_module(dev->orig_node);
        target_submod = dev->orig_node->module;
    } else {
        LOGINT(module->ctx);
        return;
    }
    lys_switch_deviation(dev, module, unres);

    /* clear the deviation flag if possible */
    while ((mod = ly_ctx_get_module_iter(module->ctx, &idx))) {
        if ((mod == module) || (mod == target_mod)) {
            continue;
        }

        for (j = 0; j < mod->deviation_size; ++j) {
            ptr = strstr(mod->deviation[j].target_name, target_mod->name);
            if (ptr && (ptr[strlen(target_mod->name)] == ':')) {
                /* some other module deviation targets the inspected module, flag remains */
                break;
            }
        }

        if (j < mod->deviation_size) {
            break;
        }
    }

    if (!mod) {
        target_mod->deviated = 0;    /* main module */
        target_submod->deviated = 0; /* possible submodule */
    }
}